

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_244bb14::MinMaxTest_MinValue_Test::TestBody(MinMaxTest_MinValue_Test *this)

{
  bool bVar1;
  undefined8 *puVar2;
  SEARCH_METHODS *pSVar3;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  RegisterStateCheckMMX reg_check_mmx;
  int max;
  int min;
  uint8_t b [64];
  uint8_t a [64];
  Message local_100;
  int local_f4;
  internal local_f0 [8];
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined4 uStack_e4;
  undefined2 uStack_e0;
  AssertHelper local_d0;
  MinMaxTest_MinValue_Test *local_c8;
  int local_c0;
  int local_bc;
  uint8_t local_b8 [64];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_f4 = 0;
  local_c8 = this;
  do {
    local_f0[0] = SUB21(in_FPUControlWord,0);
    local_78 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    local_b8[0] = 0xff;
    local_b8[1] = 0xff;
    local_b8[2] = 0xff;
    local_b8[3] = 0xff;
    local_b8[4] = 0xff;
    local_b8[5] = 0xff;
    local_b8[6] = 0xff;
    local_b8[7] = 0xff;
    local_b8[8] = 0xff;
    local_b8[9] = 0xff;
    local_b8[10] = 0xff;
    local_b8[0xb] = 0xff;
    local_b8[0xc] = 0xff;
    local_b8[0xd] = 0xff;
    local_b8[0xe] = 0xff;
    local_b8[0xf] = 0xff;
    local_b8[0x10] = 0xff;
    local_b8[0x11] = 0xff;
    local_b8[0x12] = 0xff;
    local_b8[0x13] = 0xff;
    local_b8[0x14] = 0xff;
    local_b8[0x15] = 0xff;
    local_b8[0x16] = 0xff;
    local_b8[0x17] = 0xff;
    local_b8[0x18] = 0xff;
    local_b8[0x19] = 0xff;
    local_b8[0x1a] = 0xff;
    local_b8[0x1b] = 0xff;
    local_b8[0x1c] = 0xff;
    local_b8[0x1d] = 0xff;
    local_b8[0x1e] = 0xff;
    local_b8[0x1f] = 0xff;
    local_b8[0x20] = 0xff;
    local_b8[0x21] = 0xff;
    local_b8[0x22] = 0xff;
    local_b8[0x23] = 0xff;
    local_b8[0x24] = 0xff;
    local_b8[0x25] = 0xff;
    local_b8[0x26] = 0xff;
    local_b8[0x27] = 0xff;
    local_b8[0x28] = 0xff;
    local_b8[0x29] = 0xff;
    local_b8[0x2a] = 0xff;
    local_b8[0x2b] = 0xff;
    local_b8[0x2c] = 0xff;
    local_b8[0x2d] = 0xff;
    local_b8[0x2e] = 0xff;
    local_b8[0x2f] = 0xff;
    local_b8[0x30] = 0xff;
    local_b8[0x31] = 0xff;
    local_b8[0x32] = 0xff;
    local_b8[0x33] = 0xff;
    local_b8[0x34] = 0xff;
    local_b8[0x35] = 0xff;
    local_b8[0x36] = 0xff;
    local_b8[0x37] = 0xff;
    local_b8[0x38] = 0xff;
    local_b8[0x39] = 0xff;
    local_b8[0x3a] = 0xff;
    local_b8[0x3b] = 0xff;
    local_b8[0x3c] = 0xff;
    local_b8[0x3d] = 0xff;
    local_b8[0x3e] = 0xff;
    local_b8[0x3f] = 0xff;
    local_b8[local_f4] = (uint8_t)local_f4;
    uStack_e4 = (undefined4)in_FPUInstructionPointer;
    uStack_e0 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    local_e8 = in_FPUTagWord;
    (*(local_c8->super_MinMaxTest).mm_func_)(local_78,8,local_b8,8,&local_bc,&local_c0);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)local_f0);
    local_100.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0xff;
    testing::internal::CmpHelperEQ<int,int>(local_f0,"255","max",(int *)&local_100,&local_c0);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message(&local_100);
      puVar2 = (undefined8 *)CONCAT44(uStack_e4,CONCAT22(uStack_e6,local_e8));
      pSVar3 = "";
      if (puVar2 != (undefined8 *)0x0) {
        pSVar3 = (SEARCH_METHODS *)*puVar2;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/minmax_test.cc"
                 ,0x45,(char *)pSVar3);
      testing::internal::AssertHelper::operator=(&local_d0,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)CONCAT44(local_100.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_100.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_100.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    puVar2 = (undefined8 *)CONCAT44(uStack_e4,CONCAT22(uStack_e6,local_e8));
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    testing::internal::CmpHelperEQ<int,int>(local_f0,"i","min",&local_f4,&local_bc);
    if (local_f0[0] == (internal)0x0) {
      testing::Message::Message(&local_100);
      puVar2 = (undefined8 *)CONCAT44(uStack_e4,CONCAT22(uStack_e6,local_e8));
      pSVar3 = "";
      if (puVar2 != (undefined8 *)0x0) {
        pSVar3 = (SEARCH_METHODS *)*puVar2;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/minmax_test.cc"
                 ,0x46,(char *)pSVar3);
      testing::internal::AssertHelper::operator=(&local_d0,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)CONCAT44(local_100.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_100.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_100.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    puVar2 = (undefined8 *)CONCAT44(uStack_e4,CONCAT22(uStack_e6,local_e8));
    if (puVar2 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar2 != puVar2 + 2) {
        operator_delete((undefined8 *)*puVar2);
      }
      operator_delete(puVar2);
    }
    bVar1 = local_f4 < 0x3f;
    local_f4 = local_f4 + 1;
  } while (bVar1);
  return;
}

Assistant:

TEST_P(MinMaxTest, MinValue) {
  for (int i = 0; i < 64; i++) {
    uint8_t a[64], b[64];
    memset(a, 0, sizeof(a));
    memset(b, 255, sizeof(b));
    b[i] = i;  // Set a minimum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(255, max);
    EXPECT_EQ(i, min);
  }
}